

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O1

void __thiscall cmExportFileGenerator::cmExportFileGenerator(cmExportFileGenerator *this)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_cmExportFileGenerator = (_func_int **)&PTR__cmExportFileGenerator_00a22b48;
  (this->Namespace)._M_dataplus._M_p = (pointer)&(this->Namespace).field_2;
  (this->Namespace)._M_string_length = 0;
  (this->Namespace).field_2._M_local_buf[0] = '\0';
  (this->Configurations).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Configurations).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Configurations).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->MainImportFile)._M_dataplus._M_p = (pointer)&(this->MainImportFile).field_2;
  (this->MainImportFile)._M_string_length = 0;
  (this->MainImportFile).field_2._M_local_buf[0] = '\0';
  (this->FileDir)._M_dataplus._M_p = (pointer)&(this->FileDir).field_2;
  (this->FileDir)._M_string_length = 0;
  (this->FileDir).field_2._M_local_buf[0] = '\0';
  (this->FileBase)._M_dataplus._M_p = (pointer)&(this->FileBase).field_2;
  (this->FileBase)._M_string_length = 0;
  (this->FileBase).field_2._M_local_buf[0] = '\0';
  (this->FileExt)._M_dataplus._M_p = (pointer)&(this->FileExt).field_2;
  (this->FileExt)._M_string_length = 0;
  (this->FileExt).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->ExportedTargets)._M_t._M_impl.super__Rb_tree_header;
  (this->ExportedTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ExportedTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ExportedTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ExportedTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  p_Var1 = &(this->ExternalTargets)._M_t._M_impl.super__Rb_tree_header;
  (this->ExternalTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ExternalTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->MissingTargets).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->MissingTargets).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ExportedTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->MissingTargets).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ExternalTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ExternalTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->ExternalTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->RequiredCMakeVersionMajor = 2;
  this->RequiredCMakeVersionMinor = 8;
  this->RequiredCMakeVersionPatch = 3;
  this->ExportPackageDependencies = false;
  this->AppendMode = false;
  this->ExportOld = false;
  return;
}

Assistant:

cmExportFileGenerator::cmExportFileGenerator()
{
  this->AppendMode = false;
  this->ExportOld = false;
}